

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::Option::expected(Option *this,int value_min,int value_max)

{
  int value_max_local;
  int value_min_local;
  Option *this_local;
  
  value_min_local = value_min;
  if (value_min < 0) {
    value_min_local = -value_min;
  }
  value_max_local = value_max;
  if (value_max < 0) {
    value_max_local = 0x20000000;
  }
  if (value_max_local < value_min_local) {
    this->expected_min_ = value_max_local;
    this->expected_max_ = value_min_local;
  }
  else {
    this->expected_max_ = value_max_local;
    this->expected_min_ = value_min_local;
  }
  return this;
}

Assistant:

CLI11_INLINE Option *Option::expected(int value_min, int value_max) {
    if(value_min < 0) {
        value_min = -value_min;
    }

    if(value_max < 0) {
        value_max = detail::expected_max_vector_size;
    }
    if(value_max < value_min) {
        expected_min_ = value_max;
        expected_max_ = value_min;
    } else {
        expected_max_ = value_max;
        expected_min_ = value_min;
    }

    return this;
}